

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

StkId luaF_close(lua_State *L,StkId level,int status,int yy)

{
  StkId pSVar1;
  TValue *pTVar2;
  StkId pSVar3;
  long lVar4;
  TValue *io2_1;
  TValue *uv;
  StkId o;
  
  lVar4 = (long)level - (L->stack).offset;
  luaF_closeupval(L,level);
  o = (L->tbclist).p;
  if (level <= o) {
    pSVar1 = (L->stack).p;
    do {
      for (pSVar3 = o + -(ulong)(o->tbclist).delta;
          (pSVar1 < pSVar3 && ((pSVar3->tbclist).delta == 0)); pSVar3 = pSVar3 + -0xffff) {
      }
      (L->tbclist).p = pSVar3;
      if (status == -1) {
        pSVar1 = (StkId)&L->l_G->nilvalue;
      }
      else {
        pSVar1 = o + 1;
        luaD_seterrorobj(L,status,pSVar1);
      }
      pSVar3 = (L->top).p;
      pTVar2 = luaT_gettmbyobj(L,&o->val,TM_CLOSE);
      (pSVar3->val).value_ = pTVar2->value_;
      (pSVar3->val).tt_ = pTVar2->tt_;
      pSVar3[1].val.value_ = (o->val).value_;
      *(lu_byte *)((long)pSVar3 + 0x18) = (o->val).tt_;
      pSVar3[2].val.value_ = (pSVar1->val).value_;
      *(lu_byte *)((long)pSVar3 + 0x28) = (pSVar1->val).tt_;
      (L->top).p = pSVar3 + 3;
      if (yy == 0) {
        luaD_callnoyield(L,pSVar3,0);
      }
      else {
        luaD_call(L,pSVar3,0);
      }
      pSVar1 = (L->stack).p;
      o = (L->tbclist).p;
      level = (StkId)((long)pSVar1 + lVar4);
    } while (level <= o);
  }
  return level;
}

Assistant:

StkId luaF_close (lua_State *L, StkId level, int status, int yy) {
  ptrdiff_t levelrel = savestack(L, level);
  luaF_closeupval(L, level);  /* first, close the upvalues */
  while (L->tbclist.p >= level) {  /* traverse tbc's down to that level */
    StkId tbc = L->tbclist.p;  /* get variable index */
    poptbclist(L);  /* remove it from list */
    prepcallclosemth(L, tbc, status, yy);  /* close variable */
    level = restorestack(L, levelrel);
  }
  return level;
}